

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::write<Imf_2_5::CharPtrIO,char*>(char **out,unsigned_long v)

{
  uchar b [8];
  
  b = (uchar  [8])v;
  CharPtrIO::writeChars(out,(char *)b,8);
  return;
}

Assistant:

void
write (T &out, unsigned long v)
{
    unsigned char b[8];

    b[0] = (unsigned char) (v);
    b[1] = (unsigned char) (v >> 8);
    b[2] = (unsigned char) (v >> 16);
    b[3] = (unsigned char) (v >> 24);

    #if ULONG_MAX == 4294967295U

	b[4] = 0;
	b[5] = 0;
	b[6] = 0;
	b[7] = 0;

    #elif ULONG_MAX == 18446744073709551615LU

	b[4] = (unsigned char) (v >> 32);
	b[5] = (unsigned char) (v >> 40);
	b[6] = (unsigned char) (v >> 48);
	b[7] = (unsigned char) (v >> 56);

    #else
	
	#error write<T> (T &out, unsigned long v) not implemented

    #endif

    writeUnsignedChars<S> (out, b, 8);
}